

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void nn_req_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_sockbase *self_00;
  
  self_00 = (nn_sockbase *)&self[-10].stopped.item;
  if (self == (nn_fsm *)0x0) {
    self_00 = (nn_sockbase *)0x0;
  }
  if (type == -3 && src == -2) {
    nn_timer_stop((nn_timer *)(self_00 + 0x45));
    *(undefined4 *)&self_00[0x37].sock = 9;
  }
  else if (*(int *)&self_00[0x37].sock != 9) {
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)&self_00[0x37].sock,(ulong)(uint)src,(ulong)(uint)type,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
            ,0x154);
    fflush(_stderr);
    nn_err_abort();
  }
  iVar1 = nn_timer_isidle((nn_timer *)(self_00 + 0x45));
  if (iVar1 != 0) {
    *(undefined4 *)&self_00[0x37].sock = 1;
    nn_fsm_stopped_noevent((nn_fsm *)(self_00 + 0x32));
    nn_sockbase_stopped(self_00);
    return;
  }
  return;
}

Assistant:

void nn_req_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&req->task.timer);
        req->state = NN_REQ_STATE_STOPPING;
    }
    if (nn_slow (req->state == NN_REQ_STATE_STOPPING)) {
        if (!nn_timer_isidle (&req->task.timer))
            return;
        req->state = NN_REQ_STATE_IDLE;
        nn_fsm_stopped_noevent (&req->fsm);
        nn_sockbase_stopped (&req->xreq.sockbase);
        return;
    }

    nn_fsm_bad_state(req->state, src, type);
}